

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<(anonymous_namespace)::WedgeUtilsSSEFuncTest_ResidualBlendingMethod_Test>::
CreateTest(TestFactoryImpl<(anonymous_namespace)::WedgeUtilsSSEFuncTest_ResidualBlendingMethod_Test>
           *this)

{
  WedgeUtilsSSEFuncTest *this_00;
  
  this_00 = (WedgeUtilsSSEFuncTest *)operator_new(0x18);
  anon_unknown.dwarf_16d3c6e::WedgeUtilsSSEFuncTest::WedgeUtilsSSEFuncTest(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__CodecTestWith3Params_00f42690;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }